

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolo-image.cpp
# Opt level: O0

void draw_label(yolo_image *im,int row,int col,yolo_image *label,float *rgb)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  float y;
  float val;
  int k;
  int i;
  int j;
  int h;
  int w;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 uVar3;
  undefined1 uVar4;
  int x;
  int iVar5;
  int iVar6;
  int local_c;
  
  iVar1 = *in_RCX;
  iVar2 = in_RCX[1];
  local_c = in_ESI;
  if (-1 < in_ESI - iVar2) {
    local_c = in_ESI - iVar2;
  }
  iVar6 = 0;
  while( true ) {
    uVar4 = false;
    if (iVar6 < iVar2) {
      uVar4 = iVar6 + local_c < in_RDI[1];
    }
    if ((bool)uVar4 == false) break;
    iVar5 = 0;
    while( true ) {
      uVar3 = false;
      if (iVar5 < iVar1) {
        uVar3 = iVar5 + in_EDX < *in_RDI;
      }
      if ((bool)uVar3 == false) break;
      for (x = 0; x < in_RCX[2]; x = x + 1) {
        y = yolo_image::get_pixel
                      ((yolo_image *)
                       CONCAT17(uVar4,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffffc4,
                                                              in_stack_ffffffffffffffc0))),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
        yolo_image::set_pixel
                  ((yolo_image *)CONCAT44(iVar6,iVar5),x,(int)y,
                   CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffc4)),
                   in_stack_ffffffffffffffc0);
      }
      iVar5 = iVar5 + 1;
    }
    iVar6 = iVar6 + 1;
  }
  return;
}

Assistant:

void draw_label(yolo_image & im, int row, int col, const yolo_image & label, const float * rgb)
{
    int w = label.w;
    int h = label.h;
    if (row - h >= 0) {
        row = row - h;
    }
    for (int j = 0; j < h && j + row < im.h; j++) {
        for (int i = 0; i < w && i + col < im.w; i++) {
            for (int k = 0; k < label.c; k++) {
                float val = label.get_pixel(i, j, k);
                im.set_pixel(i + col, j + row, k, rgb[k] * val);
            }
        }
    }
}